

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::CFG::find_loop_dominator(CFG *this,uint32_t block_id)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  const_iterator cVar4;
  SPIRBlock *pSVar5;
  long lVar6;
  uint32_t block_id_local;
  
  block_id_local = block_id;
  do {
    if (((block_id_local == 0xffffffff) ||
        (cVar4 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->preceding_edges)._M_h,&block_id_local),
        cVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
        ._M_cur == (__node_type *)0x0)) ||
       (lVar1 = *(long *)((long)cVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                                ._M_cur + 0x18), lVar1 == 0)) {
      return 0xffffffff;
    }
    lVar2 = *(long *)((long)cVar4.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                            ._M_cur + 0x10);
    for (lVar6 = 0; lVar1 << 2 != lVar6; lVar6 = lVar6 + 4) {
      pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(this->compiler,*(uint32_t *)(lVar2 + lVar6));
      if (pSVar5->merge == MergeSelection) {
        if ((pSVar5->next_block).id == block_id_local) {
          bVar3 = false;
          goto LAB_002fcdd5;
        }
      }
      else if ((pSVar5->merge == MergeLoop) && ((pSVar5->merge_block).id == block_id_local)) {
        bVar3 = true;
LAB_002fcdd5:
        block_id_local = *(uint32_t *)(lVar2 + lVar6);
        if (block_id_local != 0xffffffff) goto LAB_002fcddf;
        goto LAB_002fcdc6;
      }
    }
    bVar3 = false;
LAB_002fcdc6:
    block_id_local =
         **(uint32_t **)
           ((long)cVar4.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                  ._M_cur + 0x10);
LAB_002fcddf:
    if (((!bVar3) && (block_id_local != 0)) &&
       (pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(this->compiler,block_id_local),
       pSVar5->merge == MergeLoop)) {
      return block_id_local;
    }
  } while( true );
}

Assistant:

uint32_t CFG::find_loop_dominator(uint32_t block_id) const
{
	while (block_id != SPIRBlock::NoDominator)
	{
		auto itr = preceding_edges.find(block_id);
		if (itr == end(preceding_edges))
			return SPIRBlock::NoDominator;
		if (itr->second.empty())
			return SPIRBlock::NoDominator;

		uint32_t pred_block_id = SPIRBlock::NoDominator;
		bool ignore_loop_header = false;

		// If we are a merge block, go directly to the header block.
		// Only consider a loop dominator if we are branching from inside a block to a loop header.
		// NOTE: In the CFG we forced an edge from header to merge block always to support variable scopes properly.
		for (auto &pred : itr->second)
		{
			auto &pred_block = compiler.get<SPIRBlock>(pred);
			if (pred_block.merge == SPIRBlock::MergeLoop && pred_block.merge_block == ID(block_id))
			{
				pred_block_id = pred;
				ignore_loop_header = true;
				break;
			}
			else if (pred_block.merge == SPIRBlock::MergeSelection && pred_block.next_block == ID(block_id))
			{
				pred_block_id = pred;
				break;
			}
		}

		// No merge block means we can just pick any edge. Loop headers dominate the inner loop, so any path we
		// take will lead there.
		if (pred_block_id == SPIRBlock::NoDominator)
			pred_block_id = itr->second.front();

		block_id = pred_block_id;

		if (!ignore_loop_header && block_id)
		{
			auto &block = compiler.get<SPIRBlock>(block_id);
			if (block.merge == SPIRBlock::MergeLoop)
				return block_id;
		}
	}

	return block_id;
}